

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_text(sqlite3_context *pCtx,char *z,int n,_func_void_void_ptr *xDel)

{
  _func_void_void_ptr *xDel_local;
  int n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  setResultStrOrError(pCtx,z,n,'\x01',xDel);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_text(
  sqlite3_context *pCtx,
  const char *z,
  int n,
  void (*xDel)(void *)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(z, xDel, 0);
    return;
  }
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  setResultStrOrError(pCtx, z, n, SQLITE_UTF8, xDel);
}